

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh_ngon.cpp
# Opt level: O1

void __thiscall ON_MeshVertexFaceMap::Destroy(ON_MeshVertexFaceMap *this)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  
  puVar1 = (undefined8 *)this->m_p;
  this->m_vertex_count = 0;
  this->m_face_count = 0;
  this->m_vertex_face_map = (uint **)0x0;
  this->m_p = (void *)0x0;
  while (puVar1 != (undefined8 *)0x0) {
    puVar2 = (undefined8 *)*puVar1;
    operator_delete__(puVar1);
    puVar1 = puVar2;
  }
  return;
}

Assistant:

void ON_MeshVertexFaceMap::Destroy()
{
  ON_MeshVertexFaceMap_BLK* blk;
  ON_MeshVertexFaceMap_BLK* next;

  blk = (ON_MeshVertexFaceMap_BLK*)m_p;
  
  m_vertex_count = 0;
  m_face_count = 0;
  m_vertex_face_map = 0;
  m_p = 0;

  while ( blk )
  {
    next = blk->m_next;
    delete[] blk;
    blk = next;
  }
}